

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpndrv.h
# Opt level: O2

void __thiscall
CTcSymFuncBase::CTcSymFuncBase
          (CTcSymFuncBase *this,char *str,size_t len,int copy,int argc,int opt_argc,int varargs,
          int has_retval,int is_multimethod,int is_multimethod_base,int is_extern,int has_proto)

{
  CTcSymbol::CTcSymbol(&this->super_CTcSymbol,str,len,copy,TC_SYM_FUNC);
  (this->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
  _vptr_CVmHashEntry = (_func_int **)&PTR__CTcSymFuncBase_0030a7a0;
  (this->mod_base_ofs_list_).super_CArrayList.arr_ = (array_list_ele_t *)0x0;
  (this->mod_base_ofs_list_).super_CArrayList.cnt_ = 0;
  (this->mod_base_ofs_list_).super_CArrayList.alloc_ = 0x10;
  (this->mod_base_ofs_list_).super_CArrayList.inc_siz_ = 0x10;
  (this->mod_base_ofs_list_).super_CArrayList._vptr_CArrayList =
       (_func_int **)&PTR__CArrayList_003022e8;
  this->argc_ = argc;
  this->opt_argc_ = opt_argc;
  this->fixups_ = (CTcAbsFixup *)0x0;
  this->anchor_ = (CTcStreamAnchor *)0x0;
  this->code_body_ = (CTPNCodeBody *)0x0;
  this->mod_base_ = (CTcSymFunc *)0x0;
  this->mod_global_ = (CTcSymFunc *)0x0;
  this->field_0x80 =
       (char)has_proto << 7 |
       ((byte)is_extern & 1) << 2 |
       ((byte)is_multimethod_base & 1) << 5 |
       ((byte)is_multimethod & 1) << 4 | (char)has_retval * '\x02' & 2U | (byte)varargs & 1;
  return;
}

Assistant:

CTcSymFuncBase(const char *str, size_t len, int copy,
                   int argc, int opt_argc, int varargs, int has_retval,
                   int is_multimethod, int is_multimethod_base,
                   int is_extern, int has_proto)
        : CTcSymbol(str, len, copy, TC_SYM_FUNC)
    {
        /* remember the interface information */
        argc_ = argc;
        opt_argc_ = opt_argc;
        varargs_ = varargs;
        has_retval_ = has_retval;
        is_multimethod_ = is_multimethod;
        is_multimethod_base_ = is_multimethod_base;

        /* note whether it's external */
        is_extern_ = is_extern;

        /* note whether it has a prototype */
        has_proto_ = has_proto;

        /* no code stream anchor yet */
        anchor_ = 0;

        /* no fixups yet */
        fixups_ = 0;

        /* this isn't replacing an external function */
        ext_replace_ = FALSE;

        /* we don't know our code body yet */
        code_body_ = 0;

        /* there's no base modified symbol */
        mod_base_ = 0;

        /* we haven't been modified yet */
        mod_global_ = 0;

        /* assume it's not defined in this file */
        mm_def_ = FALSE;
    }